

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-custom-filter.cc
# Opt level: O0

bool __thiscall
StreamReplacer::maybeReplace
          (StreamReplacer *this,QPDFObjGen og,QPDFObjectHandle *stream,Pipeline *pipeline,
          QPDFObjectHandle *dict_updates)

{
  byte bVar1;
  uchar uVar2;
  int iVar3;
  int iVar4;
  mapped_type *pmVar5;
  byte *pbVar6;
  void *__buf;
  size_t __n;
  undefined1 local_140 [8];
  Pl_XOR p;
  unsigned_long uStack_100;
  uchar key;
  uint local_f4;
  unsigned_long local_f0;
  QPDFObjectHandle local_e8;
  allocator<char> local_d1;
  QPDFObjectHandle local_d0 [2];
  shared_ptr<Buffer> local_b0;
  undefined1 local_a0 [8];
  shared_ptr<Buffer> out;
  allocator<char> local_79;
  string local_78 [32];
  undefined1 local_58 [8];
  QPDFObjectHandle mark;
  QPDFObjectHandle dict;
  QPDFObjectHandle *dict_updates_local;
  Pipeline *pipeline_local;
  QPDFObjectHandle *stream_local;
  StreamReplacer *this_local;
  QPDFObjGen og_local;
  
  unique0x10000464 = og;
  QPDFObjectHandle::getDict();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_78,"/DoXOR",&local_79);
  QPDFObjectHandle::getKey((string *)local_58);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator(&local_79);
  bVar1 = QPDFObjectHandle::isBool();
  if (((bVar1 & 1) == 0) || (bVar1 = QPDFObjectHandle::getBoolValue(), (bVar1 & 1) == 0)) {
    og_local.obj._3_1_ = 0;
    out.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 1;
  }
  else {
    std::shared_ptr<Buffer>::shared_ptr((shared_ptr<Buffer> *)local_a0);
    QPDFObjectHandle::getStreamData((qpdf_stream_decode_level_e)&local_b0);
    std::shared_ptr<Buffer>::operator=((shared_ptr<Buffer> *)local_a0,&local_b0);
    std::shared_ptr<Buffer>::~shared_ptr(&local_b0);
    if (dict_updates != (QPDFObjectHandle *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_d0,"/OrigLength",&local_d1)
      ;
      std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_a0);
      local_f0 = Buffer::getSize();
      QIntC::to_longlong<unsigned_long>(&local_f0);
      QPDFObjectHandle::newInteger((longlong)&local_e8);
      QPDFObjectHandle::replaceKey((string *)dict_updates,local_d0);
      QPDFObjectHandle::~QPDFObjectHandle(&local_e8);
      std::__cxx11::string::~string((string *)local_d0);
      std::allocator<char>::~allocator(&local_d1);
      iVar3 = QPDFObjGen::getObj((QPDFObjGen *)((long)&this_local + 4));
      std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_a0);
      uStack_100 = Buffer::getSize();
      iVar4 = QIntC::to_int<unsigned_long>(&stack0xffffffffffffff00);
      local_f4 = iVar3 * iVar4 & 0xff;
      uVar2 = QIntC::to_uchar<int>((int *)&local_f4);
      pmVar5 = std::
               map<QPDFObjGen,_unsigned_char,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_unsigned_char>_>_>
               ::operator[](&this->keys,(key_type *)((long)&this_local + 4));
      *pmVar5 = uVar2;
    }
    if (pipeline != (Pipeline *)0x0) {
      pbVar6 = std::
               map<QPDFObjGen,_unsigned_char,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_unsigned_char>_>_>
               ::operator[](&this->keys,(key_type *)((long)&this_local + 4));
      p._55_1_ = *pbVar6;
      __n = (size_t)(byte)p._55_1_;
      Pl_XOR::Pl_XOR((Pl_XOR *)local_140,"xor",pipeline,p._55_1_);
      std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_a0);
      iVar3 = Buffer::getBuffer();
      std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_a0);
      __buf = (void *)Buffer::getSize();
      Pl_XOR::write((Pl_XOR *)local_140,iVar3,__buf,__n);
      Pl_XOR::finish((Pl_XOR *)local_140);
      Pl_XOR::~Pl_XOR((Pl_XOR *)local_140);
    }
    og_local.obj._3_1_ = 1;
    out.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 1;
    std::shared_ptr<Buffer>::~shared_ptr((shared_ptr<Buffer> *)local_a0);
  }
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_58);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &mark.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return (bool)(og_local.obj._3_1_ & 1);
}

Assistant:

bool
StreamReplacer::maybeReplace(
    QPDFObjGen og, QPDFObjectHandle& stream, Pipeline* pipeline, QPDFObjectHandle* dict_updates)
{
    // As described in the class comments, this method is called twice. Before writing has started
    // pipeline is nullptr, and dict_updates is provided. In this mode, we figure out whether we
    // should replace the stream and, if so, take care of the necessary setup. When we are actually
    // ready to supply the data, this method is called again with pipeline populated and
    // dict_updates as a nullptr. In this mode, we are not allowed to change anything, since writing
    // is already in progress. We must simply provide the stream data.

    // The return value indicates whether or not we should replace the stream. If the first call
    // returns false, there will be no second call. If the second call returns false, something went
    // wrong since the method should always make the same decision for a given stream.

    // For this example, all the determination logic could have appeared inside the if
    // (dict_updates) block rather than being duplicated, but in some cases, there may be a reason
    // to duplicate things. For example, if you wanted to write code that re-encoded an image if the
    // new encoding was more efficient, you'd have to actually try it out. Then you would either
    // have to cache the result somewhere or just repeat the calculations, depending on space/time
    // constraints, etc.

    // In our contrived example, we are replacing the data for all streams that have /DoXOR = true
    // in the stream dictionary. If this were a more realistic application, our criteria would be
    // more sensible. For example, an image downsampler might choose to replace a stream that
    // represented an image with a high pixel density.
    auto dict = stream.getDict();
    auto mark = dict.getKey("/DoXOR");
    if (!(mark.isBool() && mark.getBoolValue())) {
        return false;
    }

    // We can't replace the stream data if we can't get the original stream data for any reason. A
    // more realistic application may actually look at the data here as well, or it may be able to
    // make all its decisions from the stream dictionary. However, it's a good idea to make sure we
    // can retrieve the filtered data if we are going to need it later.
    std::shared_ptr<Buffer> out;
    try {
        out = stream.getStreamData();
    } catch (...) {
        return false;
    }

    if (dict_updates) {
        // It's not safe to make any modifications to any objects during the writing process since
        // the updated objects may have already been written. In this mode, when dict_updates is
        // provided, we have not started writing. Store the modifications we intend to make to the
        // stream dictionary here. We're just storing /OrigLength for purposes of example. Again, a
        // realistic application would make other changes. For example, an image resampler might
        // change the dimensions or other properties of the image.
        dict_updates->replaceKey(
            "/OrigLength", QPDFObjectHandle::newInteger(QIntC::to_longlong(out->getSize())));
        // We are also storing the "key" that we will access when writing the data.
        this->keys[og] = QIntC::to_uchar((og.getObj() * QIntC::to_int(out->getSize())) & 0xff);
    }

    if (pipeline) {
        unsigned char key = this->keys[og];
        Pl_XOR p("xor", pipeline, key);
        p.write(out->getBuffer(), out->getSize());
        p.finish();
    }
    return true;
}